

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBar::_q_rightArrowClicked(ToolBar *this)

{
  Orientation OVar1;
  int iVar2;
  ToolBarPrivate *pTVar3;
  int local_14;
  int delta;
  ToolBar *this_local;
  
  pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  OVar1 = ToolBarLayout::orientation(pTVar3->layout);
  if (OVar1 == Horizontal) {
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    local_14 = QSize::width(&pTVar3->iconSize);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = (**(code **)(*(long *)pTVar3->layout + 0x60))();
    local_14 = local_14 + iVar2;
  }
  else {
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    local_14 = QSize::height(&pTVar3->iconSize);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = (**(code **)(*(long *)pTVar3->layout + 0x60))();
    local_14 = local_14 + iVar2;
  }
  pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  ToolBarLayout::setOffset(pTVar3->layout,local_14);
  QWidget::update();
  return;
}

Assistant:

void
ToolBar::_q_rightArrowClicked()
{
	int delta = 0;

	if( d->layout->orientation() == Qt::Horizontal )
		delta = d->iconSize.width() + d->layout->spacing();
	else
		delta = d->iconSize.height() + d->layout->spacing();

	d->layout->setOffset( delta );

	update();
}